

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O3

void __thiscall Jinx::Impl::Lexer::ParseComment(Lexer *this)

{
  char *pcVar1;
  char cVar2;
  size_t sVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  
  sVar3 = GetUtf8CharSize(this->m_current);
  pcVar1 = this->m_current;
  pcVar6 = pcVar1 + sVar3;
  this->m_current = pcVar6;
  this->m_columnNumber = this->m_columnNumber + 1;
  cVar2 = pcVar1[sVar3];
  if ((cVar2 != '\0') && (pcVar6 <= this->m_end)) {
    if (pcVar6[1] == '-') {
      sVar3 = GetUtf8CharSize(pcVar6);
      pcVar4 = this->m_end;
      pcVar1 = this->m_current;
      pcVar6 = pcVar1 + sVar3;
      this->m_current = pcVar6;
      this->m_columnNumber = this->m_columnNumber + 1;
      cVar2 = pcVar1[sVar3];
      if (cVar2 == '-' && pcVar6 <= pcVar4) {
        do {
          sVar3 = GetUtf8CharSize(pcVar6);
          pcVar4 = this->m_end;
          pcVar1 = this->m_current;
          pcVar6 = pcVar1 + sVar3;
          this->m_current = pcVar6;
          this->m_columnNumber = this->m_columnNumber + 1;
          cVar2 = pcVar1[sVar3];
          if (cVar2 != '-') break;
        } while (pcVar6 <= pcVar4);
      }
      if (cVar2 != '\0') {
        while (pcVar6 <= pcVar4) {
          if ((cVar2 == '-') && (pcVar6 <= pcVar4)) {
            uVar5 = 0;
            do {
              uVar5 = uVar5 + 1;
              sVar3 = GetUtf8CharSize(pcVar6);
              pcVar1 = this->m_current;
              pcVar6 = pcVar1 + sVar3;
              this->m_current = pcVar6;
              this->m_columnNumber = this->m_columnNumber + 1;
              cVar2 = pcVar1[sVar3];
              if (cVar2 != '-') break;
            } while (pcVar6 <= this->m_end);
            if (2 < uVar5) {
              return;
            }
          }
          if ((cVar2 == '\r') || (cVar2 == '\n')) {
            ParseEndOfLine(this);
            pcVar6 = this->m_current;
          }
          else {
            sVar3 = GetUtf8CharSize(pcVar6);
            pcVar6 = this->m_current + sVar3;
            this->m_current = pcVar6;
            this->m_columnNumber = this->m_columnNumber + 1;
          }
          cVar2 = *pcVar6;
          if (cVar2 == '\0') break;
          pcVar4 = this->m_end;
        }
      }
      Error<>(this,"Mismatched block comments");
      return;
    }
    do {
      if ((cVar2 == '\r') || (cVar2 == '\n')) {
        ParseEndOfLine(this);
        return;
      }
      sVar3 = GetUtf8CharSize(pcVar6);
      pcVar1 = this->m_current;
      pcVar6 = pcVar1 + sVar3;
      this->m_current = pcVar6;
      this->m_columnNumber = this->m_columnNumber + 1;
      cVar2 = pcVar1[sVar3];
    } while ((cVar2 != '\0') && (pcVar6 <= this->m_end));
  }
  return;
}

Assistant:

inline_t void Lexer::ParseComment()
	{
		AdvanceCurrent();
		bool blockComment = IsNextCharacter('-');

		// This is a block comment
		if (blockComment)
		{
			AdvanceCurrent();

			// Advance until the end of the line or until we stop seeing dashes
			while (!IsEndOfText())
			{
				if (*m_current != '-')
					break;
				AdvanceCurrent();
			}

			// Find minimum run of three dashes to closed block comment
			while (!IsEndOfText())
			{
				uint32_t dashCount = 0;
				while (!IsEndOfText() && *m_current == '-')
				{
					dashCount++;
					AdvanceCurrent();
				}
				if (dashCount >= 3)
					return;
				else if (IsNewline(*m_current))
					ParseEndOfLine();
				else
					AdvanceCurrent();
			}
			Error("Mismatched block comments");
		}
		// This is a single line comment
		else
		{
			// Advance until the end of the line, then return
			while (!IsEndOfText())
			{
				if (IsNewline(*m_current))
				{
					ParseEndOfLine();
					return;
				}
				AdvanceCurrent();
			}
		}
	}